

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

void print_jit_status(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *s;
  int n;
  lua_State *L_local;
  
  lua_getfield(L,-10000,"_LOADED");
  lua_getfield(L,-1,"jit");
  lua_remove(L,-2);
  lua_getfield(L,-1,"status");
  lua_remove(L,-2);
  s._4_4_ = lua_gettop(L);
  lua_call(L,0,-1);
  iVar1 = lua_toboolean(L,s._4_4_);
  pcVar2 = "JIT: OFF";
  if (iVar1 != 0) {
    pcVar2 = "JIT: ON";
  }
  fputs(pcVar2,_stdout);
  while( true ) {
    s._4_4_ = s._4_4_ + 1;
    pcVar2 = lua_tolstring(L,s._4_4_,(size_t *)0x0);
    if (pcVar2 == (char *)0x0) break;
    putc(0x20,_stdout);
    fputs(pcVar2,_stdout);
  }
  putc(10,_stdout);
  lua_settop(L,0);
  return;
}

Assistant:

static void print_jit_status(lua_State *L)
{
  int n;
  const char *s;
  lua_getfield(L, LUA_REGISTRYINDEX, "_LOADED");
  lua_getfield(L, -1, "jit");  /* Get jit.* module table. */
  lua_remove(L, -2);
  lua_getfield(L, -1, "status");
  lua_remove(L, -2);
  n = lua_gettop(L);
  lua_call(L, 0, LUA_MULTRET);
  fputs(lua_toboolean(L, n) ? "JIT: ON" : "JIT: OFF", stdout);
  for (n++; (s = lua_tostring(L, n)); n++) {
    putc(' ', stdout);
    fputs(s, stdout);
  }
  putc('\n', stdout);
  lua_settop(L, 0);  /* clear stack */
}